

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O0

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> * __thiscall
kainjow::mustache::html_escape<std::__cxx11::wstring>
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__,mustache *this,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *s)

{
  bool bVar1;
  reference pwVar2;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined8 local_108;
  undefined4 *local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined8 local_d8;
  undefined4 *local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined4 *local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 *local_88;
  undefined8 local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 *local_60;
  undefined8 local_58;
  wchar_t local_4c;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  _Stack_48;
  wchar_t ch;
  const_iterator __end0;
  const_iterator __begin0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *__range2;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *s_local;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *ret;
  
  std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__);
  std::__cxx11::wstring::size();
  std::__cxx11::wstring::reserve((ulong)__return_storage_ptr__);
  __end0._M_current = (wchar_t *)std::__cxx11::wstring::begin();
  _Stack_48._M_current = (wchar_t *)std::__cxx11::wstring::end();
  while (bVar1 = __gnu_cxx::operator!=(&__end0,&stack0xffffffffffffffb8), bVar1) {
    pwVar2 = __gnu_cxx::
             __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
             ::operator*(&__end0);
    local_4c = *pwVar2;
    switch(local_4c) {
    case L'\"':
      local_e8 = 0x26;
      uStack_e4 = 0x71;
      uStack_e0 = 0x75;
      uStack_dc = 0x6f;
      local_d8 = 0x3b00000074;
      local_c8 = &local_e8;
      local_c0 = 6;
      std::__cxx11::wstring::append(__return_storage_ptr__,local_c8,6);
      break;
    default:
      std::__cxx11::wstring::append((ulong)__return_storage_ptr__,L'\x01');
      break;
    case L'&':
      local_78 = 0x26;
      uStack_74 = 0x61;
      uStack_70 = 0x6d;
      uStack_6c = 0x70;
      local_68 = 0x3b;
      local_60 = &local_78;
      local_58 = 5;
      std::__cxx11::wstring::append(__return_storage_ptr__,local_60,5);
      break;
    case L'\'':
      local_118 = 0x26;
      uStack_114 = 0x61;
      uStack_110 = 0x70;
      uStack_10c = 0x6f;
      local_108 = 0x3b00000073;
      local_f8 = &local_118;
      local_f0 = 6;
      std::__cxx11::wstring::append(__return_storage_ptr__,local_f8,6);
      break;
    case L'<':
      local_98 = 0x26;
      local_94 = 0x6c;
      local_90 = 0x74;
      local_8c = 0x3b;
      local_88 = &local_98;
      local_80 = 4;
      std::__cxx11::wstring::append(__return_storage_ptr__,local_88,4);
      break;
    case L'>':
      local_b8 = 0x26;
      local_b4 = 0x67;
      local_b0 = 0x74;
      local_ac = 0x3b;
      local_a8 = &local_b8;
      local_a0 = 4;
      std::__cxx11::wstring::append(__return_storage_ptr__,local_a8,4);
    }
    __gnu_cxx::
    __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

string_type html_escape(const string_type& s) {
    string_type ret;
    ret.reserve(s.size()*2);
    for (const auto ch : s) {
        switch (ch) {
            case '&':
                ret.append({'&','a','m','p',';'});
                break;
            case '<':
                ret.append({'&','l','t',';'});
                break;
            case '>':
                ret.append({'&','g','t',';'});
                break;
            case '\"':
                ret.append({'&','q','u','o','t',';'});
                break;
            case '\'':
                ret.append({'&','a','p','o','s',';'});
                break;
            default:
                ret.append(1, ch);
                break;
        }
    }
    return ret;
}